

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

void uv__iou_init(int epollfd,uv__iou *iou,uint32_t entries,uint32_t flags)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *__nptr;
  long lVar5;
  void *__addr;
  void *__addr_00;
  ulong __len;
  size_t __len_00;
  ulong uVar6;
  uv__io_uring_params params;
  ulong local_b8;
  ulong uStack_b0;
  undefined4 local_a8;
  uint uStack_a4;
  undefined8 uStack_a0;
  undefined8 local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  undefined8 uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  uint32_t local_3c;
  int local_38;
  undefined4 local_34;
  
  if (uv__use_io_uring_use_io_uring == 0) {
    __nptr = getenv("UV_USE_IO_URING");
    if (__nptr == (char *)0x0) {
      uv__use_io_uring_use_io_uring = 1;
    }
    else {
      iVar2 = atoi(__nptr);
      uv__use_io_uring_use_io_uring = -(uint)(iVar2 == 0) | 1;
    }
  }
  if ((int)uv__use_io_uring_use_io_uring < 1) {
    return;
  }
  local_b8 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_48 = 0;
  uStack_b0 = (ulong)flags;
  if ((flags & 2) != 0) {
    local_a8 = 10;
  }
  uStack_a4 = 0;
  lVar5 = syscall(0x1a9,(ulong)entries,&local_b8);
  iVar2 = (int)lVar5;
  if (iVar2 == -1) {
    return;
  }
  if ((~uStack_a4 & 0x403) != 0) goto LAB_0015c6be;
  uVar1 = (local_78 & 0xffffffff) + (local_b8 & 0xffffffff) * 4;
  uVar6 = (local_b8 >> 0x20) * 0x10 + (local_58 >> 0x20);
  __len = uVar6;
  if (uVar6 < uVar1) {
    __len = uVar1;
  }
  __len_00 = (local_b8 & 0xffffffff) << 6;
  __addr = mmap64((void *)0x0,__len,3,0x8001,iVar2,0);
  __addr_00 = mmap64((void *)0x0,__len_00,3,0x8001,iVar2,0x10000000);
  if (__addr_00 == (void *)0xffffffffffffffff || __addr == (void *)0xffffffffffffffff) {
    if (__addr != (void *)0xffffffffffffffff) goto LAB_0015c69d;
  }
  else {
    if ((flags & 2) == 0) {
LAB_0015c6d8:
      iou->sqhead = (uint32_t *)((uStack_90 & 0xffffffff) + (long)__addr);
      iou->sqtail = (uint32_t *)((uStack_90 >> 0x20) + (long)__addr);
      iou->sqmask = *(uint32_t *)((long)__addr + (local_88 & 0xffffffff));
      iou->sqarray = (uint32_t *)((local_78 & 0xffffffff) + (long)__addr);
      iou->sqflags = (uint32_t *)((uStack_80 & 0xffffffff) + (long)__addr);
      iou->cqhead = (uint32_t *)((local_68 & 0xffffffff) + (long)__addr);
      iou->cqtail = (uint32_t *)((local_68 >> 0x20) + (long)__addr);
      iou->cqmask = *(uint32_t *)((long)__addr + (uStack_60 & 0xffffffff));
      iou->sq = __addr;
      iou->cqe = (void *)((local_58 >> 0x20) + (long)__addr);
      iou->sqe = __addr_00;
      iou->sqlen = uVar1;
      iou->cqlen = uVar6;
      iou->maxlen = __len;
      iou->sqelen = __len_00;
      iou->ringfd = iVar2;
      iou->in_flight = 0;
      iou->flags = 0;
      uVar4 = uv__kernel_version();
      if (0x50eff < uVar4) {
        *(byte *)&iou->flags = (byte)iou->flags | 1;
      }
      uVar4 = 0;
      do {
        iou->sqarray[uVar4] = uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar4 <= iou->sqmask);
      return;
    }
    local_34 = 0;
    local_3c = 1;
    local_38 = iVar2;
    iVar3 = epoll_ctl(epollfd,1,iVar2,(epoll_event *)&local_3c);
    if (iVar3 == 0) goto LAB_0015c6d8;
LAB_0015c69d:
    munmap(__addr,__len);
  }
  if (__addr_00 != (void *)0xffffffffffffffff) {
    munmap(__addr_00,__len_00);
  }
LAB_0015c6be:
  uv__close(iVar2);
  return;
}

Assistant:

static void uv__iou_init(int epollfd,
                         struct uv__iou* iou,
                         uint32_t entries,
                         uint32_t flags) {
  struct uv__io_uring_params params;
  struct epoll_event e;
  size_t cqlen;
  size_t sqlen;
  size_t maxlen;
  size_t sqelen;
  uint32_t i;
  char* sq;
  char* sqe;
  int ringfd;

  sq = MAP_FAILED;
  sqe = MAP_FAILED;

  if (!uv__use_io_uring())
    return;

  /* SQPOLL required CAP_SYS_NICE until linux v5.12 relaxed that requirement.
   * Mostly academic because we check for a v5.13 kernel afterwards anyway.
   */
  memset(&params, 0, sizeof(params));
  params.flags = flags;

  if (flags & UV__IORING_SETUP_SQPOLL)
    params.sq_thread_idle = 10;  /* milliseconds */

  /* Kernel returns a file descriptor with O_CLOEXEC flag set. */
  ringfd = uv__io_uring_setup(entries, &params);
  if (ringfd == -1)
    return;

  /* IORING_FEAT_RSRC_TAGS is used to detect linux v5.13 but what we're
   * actually detecting is whether IORING_OP_STATX works with SQPOLL.
   */
  if (!(params.features & UV__IORING_FEAT_RSRC_TAGS))
    goto fail;

  /* Implied by IORING_FEAT_RSRC_TAGS but checked explicitly anyway. */
  if (!(params.features & UV__IORING_FEAT_SINGLE_MMAP))
    goto fail;

  /* Implied by IORING_FEAT_RSRC_TAGS but checked explicitly anyway. */
  if (!(params.features & UV__IORING_FEAT_NODROP))
    goto fail;

  sqlen = params.sq_off.array + params.sq_entries * sizeof(uint32_t);
  cqlen =
      params.cq_off.cqes + params.cq_entries * sizeof(struct uv__io_uring_cqe);
  maxlen = sqlen < cqlen ? cqlen : sqlen;
  sqelen = params.sq_entries * sizeof(struct uv__io_uring_sqe);

  sq = mmap(0,
            maxlen,
            PROT_READ | PROT_WRITE,
            MAP_SHARED | MAP_POPULATE,
            ringfd,
            0);  /* IORING_OFF_SQ_RING */

  sqe = mmap(0,
             sqelen,
             PROT_READ | PROT_WRITE,
             MAP_SHARED | MAP_POPULATE,
             ringfd,
             0x10000000ull);  /* IORING_OFF_SQES */

  if (sq == MAP_FAILED || sqe == MAP_FAILED)
    goto fail;

  if (flags & UV__IORING_SETUP_SQPOLL) {
    /* Only interested in completion events. To get notified when
     * the kernel pulls items from the submission ring, add POLLOUT.
     */
    memset(&e, 0, sizeof(e));
    e.events = POLLIN;
    e.data.fd = ringfd;

    if (epoll_ctl(epollfd, EPOLL_CTL_ADD, ringfd, &e))
      goto fail;
  }

  iou->sqhead = (uint32_t*) (sq + params.sq_off.head);
  iou->sqtail = (uint32_t*) (sq + params.sq_off.tail);
  iou->sqmask = *(uint32_t*) (sq + params.sq_off.ring_mask);
  iou->sqarray = (uint32_t*) (sq + params.sq_off.array);
  iou->sqflags = (uint32_t*) (sq + params.sq_off.flags);
  iou->cqhead = (uint32_t*) (sq + params.cq_off.head);
  iou->cqtail = (uint32_t*) (sq + params.cq_off.tail);
  iou->cqmask = *(uint32_t*) (sq + params.cq_off.ring_mask);
  iou->sq = sq;
  iou->cqe = sq + params.cq_off.cqes;
  iou->sqe = sqe;
  iou->sqlen = sqlen;
  iou->cqlen = cqlen;
  iou->maxlen = maxlen;
  iou->sqelen = sqelen;
  iou->ringfd = ringfd;
  iou->in_flight = 0;
  iou->flags = 0;

  if (uv__kernel_version() >= /* 5.15.0 */ 0x050F00)
    iou->flags |= UV__MKDIRAT_SYMLINKAT_LINKAT;

  for (i = 0; i <= iou->sqmask; i++)
    iou->sqarray[i] = i;  /* Slot -> sqe identity mapping. */

  return;

fail:
  if (sq != MAP_FAILED)
    munmap(sq, maxlen);

  if (sqe != MAP_FAILED)
    munmap(sqe, sqelen);

  uv__close(ringfd);
}